

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeObjectiveFunction.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargeObjectiveFunction::getGrad
          (FluctuatingChargeObjectiveFunction *this,
          DynamicVector<double,_std::allocator<double>_> *grad)

{
  pointer pdVar1;
  pointer ppAVar2;
  Molecule *pMVar3;
  pointer ppAVar4;
  pointer pdVar5;
  Atom *pAVar6;
  int iVar7;
  MoleculeIterator i;
  MoleculeIterator local_28;
  
  local_28._M_node = (_Base_ptr)0x0;
  pdVar5 = (grad->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (grad->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 != pdVar1) {
    memset(pdVar5,0,(long)pdVar1 - (long)pdVar5 & 0xfffffffffffffff8);
  }
  pMVar3 = SimInfo::beginMolecule(this->info_,&local_28);
  if (pMVar3 != (Molecule *)0x0) {
    iVar7 = 0;
    do {
      ppAVar4 = (pMVar3->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar2 = (pMVar3->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar4 == ppAVar2) {
        pAVar6 = (Atom *)0x0;
      }
      else {
        pAVar6 = *ppAVar4;
      }
      if (pAVar6 != (Atom *)0x0) {
        pdVar5 = (grad->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar7;
        do {
          ppAVar4 = ppAVar4 + 1;
          *pdVar5 = -*(double *)
                      (*(long *)((long)&(((pAVar6->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).flucQFrc.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                (pAVar6->super_StuntDouble).storage_) +
                      (long)(pAVar6->super_StuntDouble).localIndex_ * 8);
          if (ppAVar4 == ppAVar2) {
            pAVar6 = (Atom *)0x0;
          }
          else {
            pAVar6 = *ppAVar4;
          }
          pdVar5 = pdVar5 + 1;
          iVar7 = iVar7 + 1;
        } while (pAVar6 != (Atom *)0x0);
      }
      pMVar3 = SimInfo::nextMolecule(this->info_,&local_28);
    } while (pMVar3 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void FluctuatingChargeObjectiveFunction::getGrad(
      DynamicVector<RealType>& grad) {
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    grad.setZero();

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        grad[index++] = -atom->getFlucQFrc();
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &grad[0], nFlucQ_, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif
  }